

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::readSequence(Graph *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  reference pcVar4;
  reference this_00;
  char local_291;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_290;
  char c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  undefined8 uStack_270;
  undefined8 local_268;
  istream local_248 [8];
  fstream file;
  int local_34;
  string local_30 [4];
  int row;
  string base;
  Graph *this_local;
  
  std::__cxx11::string::string(local_30);
  local_34 = -1;
  std::fstream::fstream(local_248,"sample.fasta",_S_in);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_248,local_30);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    if (*pcVar3 == '>') {
      __range3 = (string *)0x0;
      uStack_270 = 0;
      local_268 = 0;
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&__range3);
      std::
      vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
      ::emplace_back<std::vector<char,std::allocator<char>>>
                ((vector<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>>
                  *)&this->sequences,(vector<char,_std::allocator<char>_> *)&__range3);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&__range3);
      local_34 = local_34 + 1;
    }
    else {
      __end3._M_current = (char *)std::__cxx11::string::begin();
      _Stack_290._M_current = (char *)std::__cxx11::string::end();
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffd70), bVar2) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3);
        local_291 = *pcVar4;
        if (local_291 != ' ') {
          this_00 = std::
                    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    ::operator[](&this->sequences,(long)local_34);
          std::vector<char,_std::allocator<char>_>::push_back(this_00,&local_291);
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
    }
  }
  std::fstream::~fstream(local_248);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Graph::readSequence(){
    string base;
    int row = -1;
    fstream file("sample.fasta", ios::in);
    while(!file.eof()){
        getline(file, base);
        if(base[0] == '>'){
            this->sequences.emplace_back(vector<char>());
            row++;
            continue;
        }else{
            for(auto c : base){
                if(c != ' ')
                    this->sequences[row].push_back(c);
            }
        }
    }
}